

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_escape_for_json(void)

{
  int iVar1;
  void *pvVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 uStack_10;
  
  pvVar2 = (void *)bson_utf8_escape_for_json("my",6);
  iVar1 = bcmp(pvVar2,"my\\u0000key",7);
  if (iVar1 == 0) {
    bson_free(pvVar2);
    plVar3 = (long *)bson_utf8_escape_for_json("my\"key",6);
    if (*plVar3 == 0x79656b225c796d) {
      bson_free(plVar3);
      plVar3 = (long *)bson_utf8_escape_for_json("my\\key",6);
      if (*plVar3 == 0x79656b5c5c796d) {
        bson_free(plVar3);
        pvVar2 = (void *)bson_utf8_escape_for_json("\\\"\\\"",0xffffffffffffffff);
        iVar1 = bcmp(pvVar2,"\\\\\\\"\\\\\\\"",9);
        if (iVar1 == 0) {
          bson_free(pvVar2);
          pvVar2 = (void *)bson_utf8_escape_for_json("\x0e",0xffffffffffffffff);
          iVar1 = bcmp(pvVar2,"\\u000e",7);
          if (iVar1 == 0) {
            bson_free(pvVar2);
            return;
          }
          pcVar4 = "0 == memcmp (str, \"\\\\u000e\", 7)";
          uStack_10 = 0x44;
        }
        else {
          pcVar4 = "0 == memcmp (str, \"\\\\\\\\\\\\\\\"\\\\\\\\\\\\\\\"\", 9)";
          uStack_10 = 0x40;
        }
      }
      else {
        pcVar4 = "0 == memcmp (str, \"my\\\\\\\\key\", 8)";
        uStack_10 = 0x3c;
      }
    }
    else {
      pcVar4 = "0 == memcmp (str, \"my\\\\\\\"key\", 8)";
      uStack_10 = 0x38;
    }
  }
  else {
    pcVar4 = "0 == memcmp (str, \"my\\\\u0000key\", 7)";
    uStack_10 = 0x34;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
          uStack_10,"test_bson_utf8_escape_for_json",pcVar4);
  abort();
}

Assistant:

static void
test_bson_utf8_escape_for_json (void)
{
   char *str;
   char *unescaped = "\x0e";

   str = bson_utf8_escape_for_json ("my\0key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\u0000key", 7));
   bson_free (str);

   str = bson_utf8_escape_for_json ("my\"key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\\"key", 8));
   bson_free (str);

   str = bson_utf8_escape_for_json ("my\\key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\\\key", 8));
   bson_free (str);

   str = bson_utf8_escape_for_json ("\\\"\\\"", -1);
   BSON_ASSERT (0 == memcmp (str, "\\\\\\\"\\\\\\\"", 9));
   bson_free (str);

   str = bson_utf8_escape_for_json (unescaped, -1);
   BSON_ASSERT (0 == memcmp (str, "\\u000e", 7));
   bson_free (str);
}